

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hokuyo.h
# Opt level: O3

int GetLatestHokuyoMessageHokuyo(HOKUYO *pHokuyo,char *databuf,int databuflen,int *pNbdatabytes)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int iVar8;
  ulong uVar9;
  ssize_t sVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  char *__s;
  int iVar16;
  uint uVar17;
  ulong uVar18;
  bool bVar19;
  int len;
  char *ptr;
  CHRONO chrono;
  char recvbuf [16384];
  char savebuf [8192];
  int local_60ac;
  char *local_60a8;
  int local_609c;
  timespec local_6098;
  timespec local_6088;
  undefined8 local_6078;
  undefined8 uStack_6070;
  long local_6068;
  long lStack_6060;
  timespec local_6058;
  int local_6048;
  int *local_6040;
  char local_6038 [8191];
  undefined1 auStack_4039 [8193];
  undefined1 local_2038 [8200];
  
  local_60a8 = (char *)0x0;
  local_60ac = 0;
  iVar8 = clock_getres(4,&local_6058);
  if ((iVar8 == 0) && (iVar8 = clock_gettime(4,&local_6088), iVar8 == 0)) {
    local_6048 = 0;
    local_6078 = 0;
    uStack_6070 = 0;
    local_6068 = 0;
    lStack_6060 = 0;
  }
  memset(local_6038,0,0x4000);
  memset(local_2038,0,0x2000);
  iVar8 = (pHokuyo->RS232Port).DevType;
  if (iVar8 - 1U < 4) {
    uVar9 = recv((pHokuyo->RS232Port).s,local_6038,0x1fff,0);
  }
  else {
    if (iVar8 != 0) goto LAB_0012c022;
    uVar9 = read(*(int *)&(pHokuyo->RS232Port).hDev,local_6038,0x1fff);
  }
  if (0 < (int)(uint)uVar9) {
    local_609c = databuflen;
    local_6040 = pNbdatabytes;
    if ((uint)uVar9 < 0x1fff) {
LAB_0012be67:
      iVar8 = FindLatestHokuyoMessage(local_6038,(int)uVar9,&local_60a8,&local_60ac);
      if (iVar8 != 0) {
        do {
          lVar14 = local_6068;
          lVar13 = lStack_6060;
          if (local_6048 == 0) {
            clock_gettime(4,&local_6098);
            lVar14 = ((local_6098.tv_sec + local_6068) - local_6088.tv_sec) +
                     (local_6098.tv_nsec + lStack_6060) / 1000000000;
            lVar13 = (local_6098.tv_nsec + lStack_6060) % 1000000000 - local_6088.tv_nsec;
            if (lVar13 < 0) {
              lVar14 = lVar14 + ~((ulong)-lVar13 / 1000000000);
              lVar13 = lVar13 + 1000000000 + ((ulong)-lVar13 / 1000000000) * 1000000000;
            }
          }
          if (4.0 < (double)lVar13 / 1000000000.0 + (double)lVar14) {
LAB_0012c049:
            puts("Error reading data from a Hokuyo : Message timeout. ");
            return 2;
          }
          uVar17 = (uint)uVar9;
          if (0x3ffe < uVar17) {
            puts("Error reading data from a Hokuyo : Invalid data. ");
            return 4;
          }
          iVar8 = (pHokuyo->RS232Port).DevType;
          if (iVar8 - 1U < 4) {
            sVar10 = recv((pHokuyo->RS232Port).s,local_6038 + (uVar9 & 0xffffffff),
                          (ulong)(0x3fff - uVar17),0);
            iVar8 = (int)sVar10;
          }
          else {
            if (iVar8 != 0) goto LAB_0012c022;
            sVar10 = read(*(int *)&(pHokuyo->RS232Port).hDev,local_6038 + (uVar9 & 0xffffffff),
                          (ulong)(0x3fff - uVar17));
            iVar8 = (int)sVar10;
          }
          if (iVar8 < 1) goto LAB_0012c022;
          uVar9 = (ulong)(uVar17 + iVar8);
          iVar8 = FindLatestHokuyoMessage(local_6038,uVar17 + iVar8,&local_60a8,&local_60ac);
        } while (iVar8 != 0);
      }
      iVar8 = local_609c;
      uVar18 = 0;
      memset(databuf,0,(long)local_609c);
      uVar9 = 0x1a;
      if (0x1a < (int)(local_60ac - 1U)) {
        uVar9 = (ulong)(local_60ac - 1U);
      }
      do {
        if ((local_60a8[uVar18 + 0x19] == '\n') && (local_60a8[uVar18 + 0x1a] == '\n')) {
          iVar16 = (int)uVar18;
          local_60ac = iVar16 + 0x1b;
          iVar11 = (int)((uVar18 & 0xffffffff) / 0x42) * -0x42;
          iVar15 = iVar11 + iVar16;
          uVar12 = (iVar11 + iVar16) - 2;
          uVar17 = uVar12;
          if (iVar15 < 3) {
            uVar17 = 0;
          }
          iVar16 = uVar17 + ((uint)((ulong)((long)iVar16 * 0x3e0f83e1) >> 0x24) - (iVar16 >> 0x1f))
                            * 0x40;
          *local_6040 = iVar16;
          if (iVar16 <= iVar8) {
            if (iVar16 < 1) {
              return 0;
            }
            if (uVar18 + 0x19 < 0x5b) {
              lVar13 = 0x1a;
              lVar14 = 0;
            }
            else {
              lVar13 = 0x1a;
              lVar14 = 0;
              do {
                uVar1 = *(undefined8 *)(local_60a8 + lVar13);
                uVar2 = *(undefined8 *)(local_60a8 + lVar13 + 8);
                uVar3 = *(undefined8 *)(local_60a8 + lVar13 + 0x10);
                uVar4 = *(undefined8 *)(local_60a8 + lVar13 + 0x10 + 8);
                uVar5 = *(undefined8 *)(local_60a8 + lVar13 + 0x20);
                uVar6 = *(undefined8 *)(local_60a8 + lVar13 + 0x20 + 8);
                uVar7 = *(undefined8 *)(local_60a8 + lVar13 + 0x30 + 8);
                *(undefined8 *)(databuf + lVar14 + 0x30) =
                     *(undefined8 *)(local_60a8 + lVar13 + 0x30);
                *(undefined8 *)(databuf + lVar14 + 0x30 + 8) = uVar7;
                *(undefined8 *)(databuf + lVar14 + 0x20) = uVar5;
                *(undefined8 *)(databuf + lVar14 + 0x20 + 8) = uVar6;
                *(undefined8 *)(databuf + lVar14 + 0x10) = uVar3;
                *(undefined8 *)(databuf + lVar14 + 0x10 + 8) = uVar4;
                *(undefined8 *)(databuf + lVar14) = uVar1;
                *(undefined8 *)(databuf + lVar14 + 8) = uVar2;
                lVar14 = lVar14 + 0x40;
                lVar13 = lVar13 + 0x42;
              } while (((int)(uVar18 / 0x42) + (uint)(uVar18 / 0x42 == 0)) * 0x40 != (int)lVar14);
            }
            if (iVar15 < 3) {
              return 0;
            }
            memcpy(databuf + lVar14,local_60a8 + lVar13,(ulong)uVar12);
            return 0;
          }
          __s = "Too small data buffer.";
          goto LAB_0012c029;
        }
        uVar18 = uVar18 + 1;
      } while (uVar9 - 0x19 != uVar18);
    }
    else {
      do {
        if ((int)uVar9 != 0x1fff) {
          uVar18 = uVar9 & 0xffffffff;
          memmove(auStack_4039 + -uVar18,local_6038,uVar18);
          memcpy(local_6038,local_2038 + uVar18,(long)(0x1fff - (int)uVar9));
          uVar9 = 0x1fff;
          goto LAB_0012be67;
        }
        lVar14 = local_6068;
        lVar13 = lStack_6060;
        if (local_6048 == 0) {
          clock_gettime(4,&local_6098);
          lVar14 = ((local_6098.tv_sec + local_6068) - local_6088.tv_sec) +
                   (local_6098.tv_nsec + lStack_6060) / 1000000000;
          lVar13 = (local_6098.tv_nsec + lStack_6060) % 1000000000 - local_6088.tv_nsec;
          if (lVar13 < 0) {
            lVar14 = lVar14 + ~((ulong)-lVar13 / 1000000000);
            lVar13 = lVar13 + 1000000000 + ((ulong)-lVar13 / 1000000000) * 1000000000;
          }
        }
        if (4.0 < (double)lVar13 / 1000000000.0 + (double)lVar14) goto LAB_0012c049;
        memcpy(local_2038,local_6038,0x1fff);
        iVar8 = (pHokuyo->RS232Port).DevType;
        if (iVar8 - 1U < 4) {
          bVar19 = false;
          uVar9 = recv((pHokuyo->RS232Port).s,local_6038,0x1fff,0);
          if ((int)uVar9 < 1) break;
        }
        else {
          if (iVar8 != 0) break;
          uVar9 = read(*(int *)&(pHokuyo->RS232Port).hDev,local_6038,0x1fff);
          bVar19 = (int)uVar9 == 0;
          if ((int)uVar9 < 0) break;
        }
      } while (!bVar19);
    }
  }
LAB_0012c022:
  __s = "Error reading data from a Hokuyo. ";
LAB_0012c029:
  puts(__s);
  return 1;
}

Assistant:

inline int GetLatestHokuyoMessageHokuyo(HOKUYO* pHokuyo, char* databuf, int databuflen, int* pNbdatabytes)
{
	char recvbuf[2*MAX_NB_BYTES_HOKUYO];
	char savebuf[MAX_NB_BYTES_HOKUYO];
	int BytesReceived = 0, Bytes = 0, recvbuflen = 0;
	char* ptr = NULL;
	int len = 0;
	int i = 0, j = 0, k = 0, nbFullDataBlocks = 0, PartialDataBlockLen = 0;
	CHRONO chrono;

	StartChrono(&chrono);

	// Prepare the buffers.
	memset(recvbuf, 0, sizeof(recvbuf));
	memset(savebuf, 0, sizeof(savebuf));
	recvbuflen = MAX_NB_BYTES_HOKUYO-1; // The last character must be a 0 to be a valid string for sscanf.
	BytesReceived = 0;

	if (ReadRS232Port(&pHokuyo->RS232Port, (unsigned char*)recvbuf, recvbuflen, &Bytes) != EXIT_SUCCESS)
	{
		printf("Error reading data from a Hokuyo. \n");
		return EXIT_FAILURE;
	}
	BytesReceived += Bytes;

	if (BytesReceived >= recvbuflen)
	{
		// If the buffer is full and if the device always sends data, there might be old data to discard...

		while (Bytes == recvbuflen)
		{
			if (GetTimeElapsedChronoQuick(&chrono) > TIMEOUT_MESSAGE_HOKUYO)
			{
				printf("Error reading data from a Hokuyo : Message timeout. \n");
				return EXIT_TIMEOUT;
			}
			memcpy(savebuf, recvbuf, Bytes);
			if (ReadRS232Port(&pHokuyo->RS232Port, (unsigned char*)recvbuf, recvbuflen, &Bytes) != EXIT_SUCCESS)
			{
				printf("Error reading data from a Hokuyo. \n");
				return EXIT_FAILURE;
			}
			BytesReceived += Bytes;
		}

		// The desired message should be among all the data gathered, unless there was 
		// so many other messages sent after that the desired message was in the 
		// discarded data, or we did not wait enough...

		memmove(recvbuf+recvbuflen-Bytes, recvbuf, Bytes);
		memcpy(recvbuf, savebuf+Bytes, recvbuflen-Bytes);

		// Only the last recvbuflen bytes received should be taken into account in what follows.
		BytesReceived = recvbuflen;
	}

	// The data need to be analyzed and we must check if we need to get more data from 
	// the device to get the desired message.
	// But normally we should not have to get more data unless we did not wait enough
	// for the desired message...

	while (FindLatestHokuyoMessage(recvbuf, BytesReceived, &ptr, &len) != EXIT_SUCCESS)
	{
		if (GetTimeElapsedChronoQuick(&chrono) > TIMEOUT_MESSAGE_HOKUYO)
		{
			printf("Error reading data from a Hokuyo : Message timeout. \n");
			return EXIT_TIMEOUT;
		}
		// The last character must be a 0 to be a valid string for sscanf.
		if (BytesReceived >= 2*MAX_NB_BYTES_HOKUYO-1)
		{
			printf("Error reading data from a Hokuyo : Invalid data. \n");
			return EXIT_INVALID_DATA;
		}
		if (ReadRS232Port(&pHokuyo->RS232Port, (unsigned char*)recvbuf+BytesReceived, 2*MAX_NB_BYTES_HOKUYO-1-BytesReceived, &Bytes) != EXIT_SUCCESS)
		{
			printf("Error reading data from a Hokuyo. \n");
			return EXIT_FAILURE;
		}
		BytesReceived += Bytes;
	}

	// Get data bytes.
	memset(databuf, 0, databuflen);
		
	// MD response...
	// "MD%04d%04d%02d%01d%02d\n99b\n%04d%01d\n  %01d\n    %01d\n\n" ..., &RemainingScans, &TimeStamp, &sum

	i = 25;
	for (;;)
	{
		if ((ptr[i] == '\n')&&(ptr[i+1] == '\n')) break;
		i++;
		if (i >= len-1) 
		{
			printf("Error reading data from a Hokuyo. \n");
			return EXIT_FAILURE;
		}
	}

	len = i+2;

	nbFullDataBlocks = (len-27)/66;
	PartialDataBlockLen = (len-27)%66-2;

	// If PartialDataBlockLen <= 0, no partial block, only full of 64 bytes.
	*pNbdatabytes = (PartialDataBlockLen <= 0)? 64*nbFullDataBlocks: 64*nbFullDataBlocks+PartialDataBlockLen;

	// Check the number of data bytes before copy.
	if (databuflen < *pNbdatabytes)
	{
		printf("Too small data buffer.\n");
		return EXIT_FAILURE;
	}

	// Copy the data bytes of the message.
	if (*pNbdatabytes > 0)
	{
		j = 0;
		i = 26;
		for (k = 0; k < nbFullDataBlocks; k++)
		{
			memcpy(databuf+j, ptr+i, 64);
			j += 64;
			i += 66;
		}
		if (PartialDataBlockLen > 0) memcpy(databuf+j, ptr+i, PartialDataBlockLen);
	}

	return EXIT_SUCCESS;
}